

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManDumpAll(If_DsdMan_t *p,int Support)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  void *pvVar3;
  word *pTruth;
  int i;
  
  __stream = fopen("tts_all.txt","wb");
  if (__stream != (FILE *)0x0) {
    iVar1 = 6;
    if (6 < (uint)Support) {
      iVar1 = Support;
    }
    for (i = 0; i < (p->vObjs).nSize; i = i + 1) {
      pvVar3 = Vec_PtrEntry(&p->vObjs,i);
      if ((Support == 0) || ((*(uint *)((long)pvVar3 + 4) >> 3 & 0x1f) == Support)) {
        iVar2 = Abc_Var2Lit(i,0);
        pTruth = If_DsdManComputeTruth(p,iVar2,(uchar *)0x0);
        fwrite("0x",2,1,__stream);
        iVar2 = iVar1;
        if (Support == 0) {
          iVar2 = p->nVars;
        }
        Abc_TtPrintHexRev((FILE *)__stream,pTruth,iVar2);
        fputc(10,__stream);
      }
    }
    fclose(__stream);
    return;
  }
  printf("Cannot open file \"%s\".\n","tts_all.txt");
  return;
}

Assistant:

void If_DsdManDumpAll( If_DsdMan_t * p, int Support )
{
    extern word * If_DsdManComputeTruth( If_DsdMan_t * p, int iDsd, unsigned char * pPermLits );
    char * pFileName = "tts_all.txt";
    If_DsdObj_t * pObj;
    word * pRes; int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( Support && Support != If_DsdObjSuppSize(pObj) )
            continue;
        pRes = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
        fprintf( pFile, "0x" );
        Abc_TtPrintHexRev( pFile, pRes, Support ? Abc_MaxInt(Support, 6) : p->nVars );
        fprintf( pFile, "\n" );
//        printf( "    " );
//        Dau_DsdPrintFromTruth( pRes, p->nVars );
    }
    fclose( pFile );
}